

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestResults.cpp
# Opt level: O0

void __thiscall
UnitTest::TestResults::OnTestFailure(TestResults *this,TestDetails *test,char *failure)

{
  char *failure_local;
  TestDetails *test_local;
  TestResults *this_local;
  
  this->m_failureCount = this->m_failureCount + 1;
  if ((this->m_currentTestFailed & 1U) == 0) {
    this->m_failedTestCount = this->m_failedTestCount + 1;
    this->m_currentTestFailed = true;
  }
  if (this->m_testReporter != (TestReporter *)0x0) {
    (*this->m_testReporter->_vptr_TestReporter[3])(this->m_testReporter,test,failure);
  }
  return;
}

Assistant:

void TestResults::OnTestFailure(TestDetails const& test, char const* failure)
{
    ++m_failureCount;
    if (!m_currentTestFailed)
    {
        ++m_failedTestCount;
        m_currentTestFailed = true;
    }

    if (m_testReporter)
        m_testReporter->ReportFailure(test, failure);
}